

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest::CaptureMetadata
          (CppMetadataTest *this,string *filename,FileDescriptorProto *file,string *pb_h,
          GeneratedCodeInfo *pb_h_info,string *proto_h,GeneratedCodeInfo *proto_h_info,string *pb_cc
          )

{
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  string_view filename_00;
  AlphaNum local_3a8;
  Status local_378;
  char *local_370;
  string local_358;
  string output_base;
  AlphaNum local_308;
  string local_2d8;
  string cpp_out;
  CppGenerator cpp_generator;
  CommandLineInterface cli;
  
  CommandLineInterface::CommandLineInterface(&cli);
  cpp_generator.runtime_include_base_._M_dataplus._M_p =
       (pointer)&cpp_generator.runtime_include_base_.field_2;
  cpp_generator.super_CodeGenerator._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_01689238;
  cpp_generator.opensource_runtime_ = true;
  cpp_generator.runtime_include_base_._M_string_length = 0;
  cpp_generator.runtime_include_base_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"--cpp_out",(allocator<char> *)&local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,anon_var_dwarf_651463 + 5,(allocator<char> *)&cpp_out);
  CommandLineInterface::RegisterGenerator
            (&cli,&local_358,&cpp_generator.super_CodeGenerator,(string *)&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_358);
  local_358._0_16_ =
       absl::lts_20250127::NullSafeStringView
                 (
                 "--cpp_out=annotate_headers=true,annotation_pragma_name=pragma_name,annotation_guard_name=guard_name:"
                 );
  testing::TempDir_abi_cxx11_();
  local_308.piece_._M_str = (char *)local_3a8.piece_._M_len;
  local_308.piece_._M_len = (size_t)local_3a8.piece_._M_str;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&cpp_out,(lts_20250127 *)&local_358,&local_308,(AlphaNum *)local_3a8.piece_._M_str);
  std::__cxx11::string::~string((string *)&local_3a8);
  bVar1 = annotation_test_util::RunProtoCompiler
                    ((string *)this,&cpp_out,&cli,(FileDescriptorProto *)filename);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_0081f2ce;
  }
  testing::TempDir_abi_cxx11_();
  local_358._M_string_length = local_378.rep_;
  local_358._M_dataplus._M_p = local_370;
  local_308.piece_ = absl::lts_20250127::NullSafeStringView("/");
  filename_00._M_str = local_370;
  filename_00._M_len = (size_t)(this->super_Test)._vptr_Test;
  StripProto_abi_cxx11_
            (&local_2d8,
             (cpp *)(this->super_Test).gtest_flag_saver_._M_t.
                    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl,
             filename_00);
  local_3a8.piece_._M_len = local_2d8._M_string_length;
  local_3a8.piece_._M_str = local_2d8._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&output_base,(lts_20250127 *)&local_358,&local_308,&local_3a8,(AlphaNum *)pb_h_info);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_378);
  if (file == (FileDescriptorProto *)0x0 || pb_h == (string *)0x0) {
LAB_0081f2b7:
    bVar1 = true;
  }
  else {
    local_308.piece_ = absl::lts_20250127::NullSafeStringView(".pb.h");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_3a8,(lts_20250127 *)&local_358,&local_308,&local_308);
    File::ReadFileToString((File *)&local_378,(string *)&local_3a8,(string *)file,false);
    if ((char *)local_378.rep_ == (char *)0x1) {
      failure_msg = (Nonnull<const_char_*>)0x0;
    }
    else {
      failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                              (&local_378,
                               "File::GetContents(absl::StrCat(output_base, \".pb.h\"), pb_h, true) is OK"
                              );
    }
    absl::lts_20250127::Status::~Status(&local_378);
    std::__cxx11::string::~string((string *)&local_3a8);
    if ((char *)local_378.rep_ != (char *)0x1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_358,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                 ,0x40,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_358);
    }
    local_358._M_string_length = (size_type)output_base._M_dataplus._M_p;
    local_358._M_dataplus._M_p = (pointer)output_base._M_string_length;
    local_308.piece_ = absl::lts_20250127::NullSafeStringView(".pb.h.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_3a8,(lts_20250127 *)&local_358,&local_308,&local_308);
    bVar1 = annotation_test_util::DecodeMetadata((string *)&local_3a8,(GeneratedCodeInfo *)pb_h);
    std::__cxx11::string::~string((string *)&local_3a8);
    if (bVar1) goto LAB_0081f2b7;
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&output_base);
LAB_0081f2ce:
  std::__cxx11::string::~string((string *)&cpp_out);
  CppGenerator::~CppGenerator(&cpp_generator);
  CommandLineInterface::~CommandLineInterface(&cli);
  return bVar1;
}

Assistant:

bool CaptureMetadata(const std::string& filename, FileDescriptorProto* file,
                       std::string* pb_h, GeneratedCodeInfo* pb_h_info,
                       std::string* proto_h, GeneratedCodeInfo* proto_h_info,
                       std::string* pb_cc) {
    CommandLineInterface cli;
    CppGenerator cpp_generator;
    cli.RegisterGenerator("--cpp_out", &cpp_generator, "");
    std::string cpp_out = absl::StrCat(
        "--cpp_out=annotate_headers=true,"
        "annotation_pragma_name=pragma_name,"
        "annotation_guard_name=guard_name:",
        ::testing::TempDir());

    const bool result = atu::RunProtoCompiler(filename, cpp_out, &cli, file);

    if (!result) {
      return result;
    }

    std::string output_base =
        absl::StrCat(::testing::TempDir(), "/", StripProto(filename));

    if (pb_cc != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".pb.cc"),
                                      pb_cc, true));
    }

    if (pb_h != nullptr && pb_h_info != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".pb.h"), pb_h,
                                      true));
      if (!atu::DecodeMetadata(absl::StrCat(output_base, ".pb.h.meta"),
                               pb_h_info)) {
        return false;
      }
    }

    if (proto_h != nullptr && proto_h_info != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".proto.h"),
                                      proto_h, true));
      if (!atu::DecodeMetadata(absl::StrCat(output_base, ".proto.h.meta"),
                               proto_h_info)) {
        return false;
      }
    }

    return true;
  }